

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  ctrl_t *pcVar3;
  slot_type *psVar4;
  undefined1 uVar5;
  slot_type *psVar6;
  slot_type *psVar7;
  
  psVar6 = (slot_type *)a->ctrl_;
  if ((psVar6 == (slot_type *)(kEmptyGroup + 0x10) || psVar6 == (slot_type *)0x0) ||
     (-1 < *(char *)psVar6)) {
    psVar1 = (slot_type *)b->ctrl_;
    if ((psVar1 != (slot_type *)(kEmptyGroup + 0x10) && psVar1 != (slot_type *)0x0) &&
       (*(char *)psVar1 < '\0')) goto LAB_0017b04b;
    if (psVar6 == (slot_type *)(kEmptyGroup + 0x10) && psVar1 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_0017b034:
      return psVar6 == psVar1;
    }
    if ((psVar6 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (psVar1 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (psVar6 == (slot_type *)0x0 || psVar1 == (slot_type *)0x0) goto LAB_0017b034;
      if ((psVar1 == (slot_type *)kSooControl) == (psVar6 == (slot_type *)kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar2 = (b->field_1).slot_;
        if (psVar6 == (slot_type *)kSooControl) {
          if ((slot_type *)a == psVar2) goto LAB_0017b034;
        }
        else {
          psVar7 = psVar2;
          psVar4 = psVar1;
          b = (iterator *)(slot_type *)a;
          if (psVar1 < psVar6) {
            psVar7 = (slot_type *)a;
            psVar4 = psVar6;
            b = (iterator *)psVar2;
          }
          if ((psVar4 < b) && (b <= psVar7)) goto LAB_0017b034;
        }
      }
      operator==();
      goto LAB_0017b046;
    }
  }
  else {
LAB_0017b046:
    operator==();
LAB_0017b04b:
    operator==();
  }
  operator==();
  pcVar3 = (ctrl_t *)((value_type *)a)->first;
  if (pcVar3 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pcVar3 != kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar3) {
      return SUB81(*(anon_union_8_1_a8a14541_for_iterator_2 *)&((value_type *)a)->second,0);
    }
    goto LAB_0017b084;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
  ::iterator::operator*((iterator *)a);
LAB_0017b084:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
  ::iterator::operator*((iterator *)a);
  if ((ctrl_t *)((value_type *)a)->first == (ctrl_t *)0x1) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                *)a);
    if ((((anon_union_8_1_a8a14541_for_iterator_2 *)&((value_type *)a)->second)->slot_ <
         (slot_type *)0x2) ||
       (psVar6 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                 ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                             *)a), (psVar6->value).first != ((value_type *)b)->first)) {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  *)a);
      uVar5 = 0;
    }
    else {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
      ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  *)a);
      uVar5 = 0x20;
    }
    return (bool)uVar5;
  }
  if ((ctrl_t *)((value_type *)a)->first != (ctrl_t *)0x0) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, absl::container_internal::HashEq<void *>::Hash, absl::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, unsigned long>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, Hash = absl::container_internal::HashEq<void *>::Hash, Eq = absl::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, unsigned long>>, K = void *]"
                 );
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, absl::container_internal::HashEq<void *>::Hash, absl::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, unsigned long>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, Hash = absl::container_internal::HashEq<void *>::Hash, Eq = absl::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, unsigned long>>]"
               );
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }